

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleColorNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  Text *this_00;
  aiLight *paVar1;
  bool bVar2;
  Property *pPVar3;
  DataArrayList *pDVar4;
  Value *pVVar5;
  char *pKey;
  aiMaterial *this_01;
  allocator<char> local_59;
  aiColor3D local_58;
  float local_4c;
  float local_48;
  ai_real local_44;
  string local_40;
  
  if (node != (DDLNode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"attrib",(allocator<char> *)&local_58);
    pPVar3 = ODDLParser::DDLNode::findPropertyByName(node,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (((pPVar3 != (Property *)0x0) && (pPVar3->m_value != (Value *)0x0)) &&
       (pDVar4 = ODDLParser::DDLNode::getDataArrayList(node), pDVar4 != (DataArrayList *)0x0)) {
      if (pDVar4->m_numItems == 4) {
        pVVar5 = pDVar4->m_dataList;
        local_48 = ODDLParser::Value::getFloat(pVVar5);
        pVVar5 = ODDLParser::Value::getNext(pVVar5);
        local_4c = ODDLParser::Value::getFloat(pVVar5);
        pVVar5 = ODDLParser::Value::getNext(pVVar5);
        local_44 = ODDLParser::Value::getFloat(pVVar5);
        pVVar5 = ODDLParser::Value::getNext(pVVar5);
        ODDLParser::Value::getFloat(pVVar5);
        local_58.b = local_44;
      }
      else {
        if (pDVar4->m_numItems != 3) {
          __assert_fail("4 == colList->m_numItems",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x3d2,"void Assimp::OpenGEX::getColorRGB4(aiColor4D *, DataArrayList *)");
        }
        pVVar5 = pDVar4->m_dataList;
        local_48 = ODDLParser::Value::getFloat(pVVar5);
        pVVar5 = ODDLParser::Value::getNext(pVVar5);
        local_4c = ODDLParser::Value::getFloat(pVVar5);
        pVVar5 = ODDLParser::Value::getNext(pVVar5);
        local_58.b = ODDLParser::Value::getFloat(pVVar5);
      }
      local_58.r = local_48;
      local_58.g = local_4c;
      this_00 = pPVar3->m_key;
      if (this_00 != (Text *)0x0) {
        bVar2 = ODDLParser::Text::operator==
                          (this_00,(string *)Grammar::DiffuseColorToken_abi_cxx11_);
        if (bVar2) {
          this_01 = this->m_currentMaterial;
          pKey = "$clr.diffuse";
        }
        else {
          bVar2 = ODDLParser::Text::operator==
                            (this_00,(string *)Grammar::SpecularColorToken_abi_cxx11_);
          if (bVar2) {
            this_01 = this->m_currentMaterial;
            pKey = "$clr.specular";
          }
          else {
            bVar2 = ODDLParser::Text::operator==
                              (this_00,(string *)Grammar::EmissionColorToken_abi_cxx11_);
            if (!bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40,"light",&local_59);
              bVar2 = ODDLParser::Text::operator==(this_00,&local_40);
              std::__cxx11::string::~string((string *)&local_40);
              if (!bVar2) {
                return;
              }
              paVar1 = this->m_currentLight;
              (paVar1->mColorDiffuse).r = local_58.r;
              (paVar1->mColorDiffuse).g = local_58.g;
              (paVar1->mColorDiffuse).b = local_58.b;
              return;
            }
            this_01 = this->m_currentMaterial;
            pKey = "$clr.emissive";
          }
        }
        aiMaterial::AddProperty(this_01,&local_58,1,pKey,0,0);
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleColorNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            DataArrayList *colList( node->getDataArrayList() );
            if( nullptr == colList ) {
                return;
            }
            aiColor3D col;
            if ( 3 == colList->m_numItems ) {
                aiColor3D col3;
                getColorRGB3( &col3, colList );
                col = col3;
            } else {
                aiColor4D col4;
                getColorRGB4( &col4, colList );
                col.r = col4.r;
                col.g = col4.g;
                col.b = col4.b;
            }
#ifdef ASSIMP_USE_HUNTER
            const ColorType colType( getColorType( &prop->m_key->m_text ) );
#else
            const ColorType colType( getColorType( prop->m_key ) );
#endif
            if( DiffuseColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_DIFFUSE );
            } else if( SpecularColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_SPECULAR );
            } else if( EmissionColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_EMISSIVE );
            } else if ( LightColor == colType ) {
                m_currentLight->mColorDiffuse = col;
            }
        }
    }
}